

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyboardImpl.cpp
# Opt level: O1

bool anon_unknown.dwarf_2e9d46::isKeyPressedImpl(KeyCode keycode)

{
  Display *display;
  undefined7 in_register_00000039;
  char keys [32];
  byte abStack_38 [40];
  
  if ((int)CONCAT71(in_register_00000039,keycode) != 0) {
    display = sf::priv::OpenDisplay();
    XQueryKeymap(display,abStack_38);
    sf::priv::CloseDisplay(display);
    return (abStack_38[keycode >> 3] >> (keycode & 7) & 1) != 0;
  }
  return false;
}

Assistant:

bool isKeyPressedImpl(KeyCode keycode)
{
    if (keycode != NullKeyCode)
    {
        Display* display = sf::priv::OpenDisplay();

        // Get the whole keyboard state
        char keys[32];
        XQueryKeymap(display, keys);

        sf::priv::CloseDisplay(display);

        // Check our keycode
        return (keys[keycode / 8] & (1 << (keycode % 8))) != 0;
    }

    return false;
}